

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

void __thiscall
QPDFObjectHandle::writeJSON
          (QPDFObjectHandle *this,int json_version,Writer *p,bool dereference_indirect)

{
  element_type *peVar1;
  Writer *this_00;
  logic_error *this_01;
  undefined3 in_register_00000009;
  QPDFObjGen local_38;
  string local_30;
  
  peVar1 = (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (CONCAT31(in_register_00000009,dereference_indirect) == 0) {
    if (peVar1 != (element_type *)0x0) {
      if ((peVar1->og).obj != 0) {
        this_00 = JSON::Writer::operator<<(p,"\"");
        peVar1 = (this->super_BaseHandle).obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar1 == (element_type *)0x0) {
          local_38.obj = 0;
          local_38.gen = 0;
        }
        else {
          local_38 = peVar1->og;
        }
        QPDFObjGen::unparse_abi_cxx11_(&local_30,&local_38,' ');
        (*this_00->p->_vptr_Pipeline[2])
                  (this_00->p,local_30._M_dataplus._M_p,local_30._M_string_length);
        JSON::Writer::operator<<(this_00," R\"");
        std::__cxx11::string::~string((string *)&local_30);
        return;
      }
      goto LAB_00199b14;
    }
  }
  else if (peVar1 != (element_type *)0x0) {
LAB_00199b14:
    ::qpdf::BaseHandle::write_json(&this->super_BaseHandle,json_version,p);
    return;
  }
  this_01 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error
            (this_01,"attempted to dereference an uninitialized QPDFObjectHandle");
  __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void
QPDFObjectHandle::writeJSON(int json_version, JSON::Writer& p, bool dereference_indirect) const
{
    if (!dereference_indirect && isIndirect()) {
        p << "\"" << getObjGen().unparse(' ') << " R\"";
    } else if (!obj) {
        throw std::logic_error("attempted to dereference an uninitialized QPDFObjectHandle");
    } else {
        write_json(json_version, p);
    }
}